

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_property.c
# Opt level: O0

int connectionSet(mpt_connection *con,mpt_convertable *src)

{
  mpt_socket local_34;
  int local_30;
  mpt_socket sd;
  int ret;
  int sock;
  char *where;
  mpt_convertable *src_local;
  mpt_connection *con_local;
  
  _ret = (char *)0x0;
  sd._id = -1;
  if (src == (mpt_convertable *)0x0) {
    con_local._4_4_ = -1;
  }
  else if (((con->out).state & 0x10) == 0) {
    where = (char *)src;
    src_local = (mpt_convertable *)con;
    local_30 = (*src->_vptr->convert)(src,1,&sd);
    if (-1 < local_30) {
      local_34._id = sd._id;
      local_30 = mpt_connection_assign((mpt_connection *)src_local,&local_34);
      if (-1 < local_30) {
        return 0;
      }
    }
    local_30 = (*(code *)**(undefined8 **)where)(where,0x73,&ret);
    con_local._4_4_ = local_30;
    if (-1 < local_30) {
      if (_ret == (char *)0x0) {
        mpt_connection_close((mpt_connection *)src_local);
        con_local._4_4_ = 0;
      }
      else {
        con_local._4_4_ = mpt_connection_open((mpt_connection *)src_local,_ret,(mpt_fdmode *)0x0);
        if (-1 < con_local._4_4_) {
          con_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    con_local._4_4_ = -4;
  }
  return con_local._4_4_;
}

Assistant:

static int connectionSet(MPT_STRUCT(connection) *con, MPT_INTERFACE(convertable) *src)
{
	const char *where = 0;
	int sock = -1;
	int ret;
	
	if (!src) {
		return MPT_ERROR(BadArgument);
	}
	if (con->out.state & MPT_OUTFLAG(Active)) {
		return MPT_ERROR(BadOperation);
	}
	if ((ret = src->_vptr->convert(src, MPT_ENUM(TypeUnixSocket), &sock)) >= 0) {
		MPT_STRUCT(socket) sd = MPT_SOCKET_INIT;
		sd._id = sock;
		if ((ret = mpt_connection_assign(con, &sd)) >= 0) {
			return 0;
		}
	}
	if ((ret = src->_vptr->convert(src, 's', &where)) < 0) {
		return ret;
	}
	if (!where) {
		mpt_connection_close(con);
		return 0;
	}
	if ((ret = mpt_connection_open(con, where, 0)) < 0) {
		return ret;
	}
	return 0;
}